

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O2

Rgba __thiscall EnvmapImage::sample(EnvmapImage *this,V2f *pos)

{
  int iVar1;
  int iVar2;
  Rgba *pRVar3;
  Rgba RVar4;
  Rgba RVar5;
  Rgba RVar6;
  Rgba RVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Rgba p;
  Rgba local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  iVar8 = Imath_3_2::floor<float>(pos->x);
  iVar1 = iVar8 + 1;
  fVar16 = (float)iVar1 - pos->x;
  fVar17 = 1.0 - fVar16;
  iVar2 = (this->_dataWindow).min.x;
  iVar12 = (this->_dataWindow).max.x;
  iVar14 = iVar12;
  if (iVar8 < iVar12) {
    iVar14 = iVar8;
  }
  iVar14 = iVar14 - iVar2;
  if (iVar8 < iVar2) {
    iVar14 = 0;
  }
  if (iVar1 < iVar12) {
    iVar12 = iVar1;
  }
  iVar12 = iVar12 - iVar2;
  if (iVar1 < iVar2) {
    iVar12 = 0;
  }
  iVar9 = Imath_3_2::floor<float>(pos->y);
  iVar1 = iVar9 + 1;
  fVar15 = (float)iVar1 - pos->y;
  fVar18 = 1.0 - fVar15;
  iVar2 = (this->_dataWindow).min.y;
  iVar8 = (this->_dataWindow).max.y;
  iVar13 = iVar8;
  if (iVar9 < iVar8) {
    iVar13 = iVar9;
  }
  iVar13 = iVar13 - iVar2;
  if (iVar9 < iVar2) {
    iVar13 = 0;
  }
  if (iVar1 < iVar8) {
    iVar8 = iVar1;
  }
  iVar8 = iVar8 - iVar2;
  if (iVar1 < iVar2) {
    iVar8 = 0;
  }
  pRVar3 = (this->_pixels)._data;
  lVar11 = (this->_pixels)._sizeY;
  lVar10 = iVar13 * lVar11;
  RVar4 = pRVar3[lVar10 + iVar14];
  local_50 = (ulong)RVar4 >> 0x20;
  local_38 = (ulong)RVar4 >> 0x30;
  RVar5 = pRVar3[lVar10 + iVar12];
  local_48 = (ulong)RVar5 >> 0x30;
  lVar11 = iVar8 * lVar11;
  RVar6 = pRVar3[lVar11 + iVar14];
  local_58 = (ulong)RVar6 >> 0x20;
  local_40 = (ulong)RVar6 >> 0x30;
  RVar7 = pRVar3[lVar11 + iVar12];
  local_60 = (ulong)RVar7 >> 0x30;
  Imath_3_2::half::operator=
            (&local_68.r,
             (*(float *)(_imath_half_to_float_table + (ulong)(RVar4._0_4_ & 0xffff) * 4) * fVar16 +
             *(float *)(_imath_half_to_float_table + (ulong)(RVar5._0_4_ & 0xffff) * 4) * fVar17) *
             fVar15 + (*(float *)(_imath_half_to_float_table + (ulong)(RVar6._0_4_ & 0xffff) * 4) *
                       fVar16 + *(float *)(_imath_half_to_float_table +
                                          (ulong)(RVar7._0_4_ & 0xffff) * 4) * fVar17) * fVar18);
  Imath_3_2::half::operator=
            (&local_68.g,
             (*(float *)(_imath_half_to_float_table + (ulong)(RVar4._0_4_ >> 0x10) * 4) * fVar16 +
             *(float *)(_imath_half_to_float_table + (ulong)(RVar5._0_4_ >> 0x10) * 4) * fVar17) *
             fVar15 + (*(float *)(_imath_half_to_float_table + (ulong)(RVar6._0_4_ >> 0x10) * 4) *
                       fVar16 + *(float *)(_imath_half_to_float_table +
                                          (ulong)(RVar7._0_4_ >> 0x10) * 4) * fVar17) * fVar18);
  Imath_3_2::half::operator=
            (&local_68.b,
             (*(float *)(_imath_half_to_float_table + (ulong)((uint)local_50 & 0xffff) * 4) * fVar16
             + *(float *)(_imath_half_to_float_table + (ulong)(RVar5._4_4_ & 0xffff) * 4) * fVar17)
             * fVar15 +
             (*(float *)(_imath_half_to_float_table + (ulong)((uint)local_58 & 0xffff) * 4) * fVar16
             + *(float *)(_imath_half_to_float_table + (ulong)(RVar7._4_4_ & 0xffff) * 4) * fVar17)
             * fVar18);
  Imath_3_2::half::operator=
            (&local_68.a,
             (*(float *)(_imath_half_to_float_table + local_38 * 4) * fVar16 +
             *(float *)(_imath_half_to_float_table + local_48 * 4) * fVar17) * fVar15 +
             (fVar16 * *(float *)(_imath_half_to_float_table + local_40 * 4) +
             fVar17 * *(float *)(_imath_half_to_float_table + local_60 * 4)) * fVar18);
  return local_68;
}

Assistant:

Rgba
EnvmapImage::sample (const V2f& pos) const
{
    //
    // Point-sample the environment map image at 2D position pos.
    // Interpolate bilinearly between the four nearest pixels.
    //

    int   x1 = IMATH::floor (pos.x);
    int   x2 = x1 + 1;
    float sx = x2 - pos.x;
    float tx = 1 - sx;

    x1 = clamp (x1, _dataWindow.min.x, _dataWindow.max.x) - _dataWindow.min.x;
    x2 = clamp (x2, _dataWindow.min.x, _dataWindow.max.x) - _dataWindow.min.x;

    int   y1 = IMATH::floor (pos.y);
    int   y2 = y1 + 1;
    float sy = y2 - pos.y;
    float ty = 1 - sy;

    y1 = clamp (y1, _dataWindow.min.y, _dataWindow.max.y) - _dataWindow.min.y;
    y2 = clamp (y2, _dataWindow.min.y, _dataWindow.max.y) - _dataWindow.min.y;

    Rgba p11 = _pixels[y1][x1];
    Rgba p12 = _pixels[y1][x2];
    Rgba p21 = _pixels[y2][x1];
    Rgba p22 = _pixels[y2][x2];

    Rgba p;
    p.r = (p11.r * sx + p12.r * tx) * sy + (p21.r * sx + p22.r * tx) * ty;
    p.g = (p11.g * sx + p12.g * tx) * sy + (p21.g * sx + p22.g * tx) * ty;
    p.b = (p11.b * sx + p12.b * tx) * sy + (p21.b * sx + p22.b * tx) * ty;
    p.a = (p11.a * sx + p12.a * tx) * sy + (p21.a * sx + p22.a * tx) * ty;

    return p;
}